

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookmempool.h
# Opt level: O1

void __thiscall
cookmem::MemPool<cookmem::CachedArena<cookmem::MallocArena>,_cookmem::NoActionMemLogger,_void>::
deallocate(MemPool<cookmem::CachedArena<cookmem::MallocArena>,_cookmem::NoActionMemLogger,_void>
           *this,void *ptr,size_type size)

{
  SmallMemChunk *chunk;
  ulong uVar1;
  long lVar2;
  undefined4 *puVar3;
  ulong uVar4;
  char *pcVar5;
  ulong uVar6;
  char cVar7;
  long lVar8;
  char cVar9;
  ulong uVar10;
  
  if (ptr == (void *)0x0) {
    return;
  }
  uVar1 = *(ulong *)((long)ptr + -8);
  if ((uVar1 & 1) == 0) {
    puVar3 = (undefined4 *)__cxa_allocate_exception(0x10);
    *puVar3 = 2;
    pcVar5 = "potentially freeing an unused pointer";
    goto LAB_0010367a;
  }
  chunk = (SmallMemChunk *)((long)ptr + -0x10);
  uVar4 = uVar1 & 0xfffffffffffffff0;
  if (this->m_padding == true) {
    if (0x10 < uVar4) {
      uVar6 = uVar4;
      if ((uVar1 & 2) != 0) {
        lVar8 = (long)*(char *)((long)ptr + (uVar4 - 0x11));
        if (0 < lVar8) {
          uVar6 = uVar4 - lVar8;
          goto LAB_0010352a;
        }
        goto LAB_00103663;
      }
LAB_0010352a:
      lVar8 = uVar4 - uVar6;
      if ((((uVar6 <= uVar4 && lVar8 != 0) && (cVar7 = (char)lVar8, '\0' < cVar7)) &&
          (((uint)lVar8 & 0x7f) + uVar6 == uVar4)) &&
         (*(char *)((long)ptr + (uVar4 - 0x11)) == cVar7)) {
        if (cVar7 != '\x01') {
          cVar9 = '\t';
          if (cVar7 < '\t') {
            cVar9 = cVar7;
          }
          cVar7 = '\x02';
          if ('\x02' < cVar9) {
            cVar7 = cVar9;
          }
          uVar10 = 0;
          do {
            if (*(char *)((long)&(chunk->super_MemChunk).m_prevFootSize + uVar10 + uVar6) !=
                this->m_paddingByte) {
              puVar3 = (undefined4 *)__cxa_allocate_exception(0x10);
              *puVar3 = 3;
              pcVar5 = "padding byte got modified.";
              goto LAB_0010367a;
            }
            uVar10 = uVar10 + 1;
          } while ((uint)(int)(char)(cVar7 + -1) != uVar10);
        }
        goto LAB_001035a8;
      }
    }
    puVar3 = (undefined4 *)__cxa_allocate_exception(0x10);
    *puVar3 = 1;
    pcVar5 = "assertion failure.";
  }
  else {
LAB_001035a8:
    if (((uVar1 & 2) == 0) || ('\0' < *(char *)((long)ptr + (uVar4 - 0x11)))) {
      *(ulong *)((long)ptr + -8) = uVar4;
      *(ulong *)((long)ptr + (uVar4 - 0x10)) = uVar4;
      if (uVar1 < 0x100) {
        lVar8 = *(long *)((long)&this->m_smallLists[0].m_head + uVar4);
        uVar4 = uVar4 >> 3;
        if (lVar8 == 0) {
          *(SmallMemChunk **)ptr = chunk;
          *(SmallMemChunk **)((long)ptr + 8) = chunk;
          this->m_smallLists[uVar4].m_head = chunk;
        }
        else {
          lVar2 = *(long *)(lVar8 + 0x10);
          *(SmallMemChunk **)(lVar8 + 0x10) = chunk;
          *(SmallMemChunk **)(lVar2 + 0x18) = chunk;
          *(long *)ptr = lVar2;
          *(long *)((long)ptr + 8) = lVar8;
        }
        if ((this->m_smallMap >> ((uint)uVar4 & 0x1f) & 1) == 0) {
          this->m_smallMap = this->m_smallMap | 1 << ((byte)uVar4 & 0x1f);
        }
        return;
      }
      addLargeChunk(this,(MemChunk *)chunk);
      return;
    }
LAB_00103663:
    puVar3 = (undefined4 *)__cxa_allocate_exception(0x10);
    *puVar3 = 3;
    pcVar5 = "Invalid padding byte value";
  }
LAB_0010367a:
  *(char **)(puVar3 + 2) = pcVar5;
  __cxa_throw(puVar3,&Exception::typeinfo,0);
}

Assistant:

void
    deallocate (T* ptr, size_type size = 0)
    {
        if (ptr != nullptr)
        {
            MemChunk* chunk = mem2Chunk (ptr);
            if (!chunk->isUsed())
            {
                throw Exception (MEM_ERROR_DOUBLE_FREE, "potentially freeing an unused pointer");
            }
            size_type chunkSize = chunk->getChunkSize ();
            if (m_padding)
            {
                COOKMEM_ASSERT (chunkSize > CHUNK_OVERHEAD);
                size_type userSize = chunk->getUserSize () + CHUNK_OVERHEAD;
                COOKMEM_ASSERT (userSize < chunkSize);
                char diff = (char)(chunkSize - userSize);
                COOKMEM_ASSERT ((diff > 0) && ((userSize + diff) == chunkSize));
                COOKMEM_ASSERT (*(((char*)chunk) + chunkSize - 1) == diff);

                char* paddingPtr = ((char*)chunk) + userSize;
                --diff;
                if (diff > 8)
                {
                    diff = 8;
                }
                for (int i = 0; i < diff; ++i)
                {
                    if (paddingPtr[i] != m_paddingByte)
                    {
                        throw Exception (MEM_ERROR_PADDING, "padding byte got modified.");
                    }
                }
            }
            m_logger.logDeallocation (ptr, chunk->getUserSize ());

            chunk->setFreeChunkSize (chunkSize);
            addChunk (chunk);
        }
        else
        {
            m_logger.logDeallocation (ptr, size);
        }
    }